

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

int ReadFile(string *path,string *contents,string *err)

{
  int iVar1;
  char *__filename;
  int *piVar2;
  size_t sVar3;
  bool bVar4;
  size_t len;
  char buf [65536];
  undefined1 local_c0 [8];
  stat st;
  FILE *f;
  string *err_local;
  string *contents_local;
  string *path_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  st.__glibc_reserved[2] = (__syscall_slong_t)fopen(__filename,"rb");
  if ((FILE *)st.__glibc_reserved[2] == (FILE *)0x0) {
    piVar2 = __errno_location();
    strerror(*piVar2);
    std::__cxx11::string::assign((char *)err);
    piVar2 = __errno_location();
    path_local._4_4_ = -*piVar2;
  }
  else {
    iVar1 = fileno((FILE *)st.__glibc_reserved[2]);
    iVar1 = fstat(iVar1,(stat *)local_c0);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      strerror(*piVar2);
      std::__cxx11::string::assign((char *)err);
      fclose((FILE *)st.__glibc_reserved[2]);
      piVar2 = __errno_location();
      path_local._4_4_ = -*piVar2;
    }
    else {
      std::__cxx11::string::reserve((ulong)contents);
      while( true ) {
        iVar1 = feof((FILE *)st.__glibc_reserved[2]);
        bVar4 = false;
        if (iVar1 == 0) {
          sVar3 = fread(&len,1,0x10000,(FILE *)st.__glibc_reserved[2]);
          bVar4 = sVar3 != 0;
        }
        if (!bVar4) break;
        std::__cxx11::string::append((char *)contents,(ulong)&len);
      }
      iVar1 = ferror((FILE *)st.__glibc_reserved[2]);
      if (iVar1 == 0) {
        fclose((FILE *)st.__glibc_reserved[2]);
        path_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        strerror(*piVar2);
        std::__cxx11::string::assign((char *)err);
        std::__cxx11::string::clear();
        fclose((FILE *)st.__glibc_reserved[2]);
        piVar2 = __errno_location();
        path_local._4_4_ = -*piVar2;
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

int ReadFile(const string& path, string* contents, string* err) {
#ifdef _WIN32
  // This makes a ninja run on a set of 1500 manifest files about 4% faster
  // than using the generic fopen code below.
  err->clear();
  HANDLE f = ::CreateFileA(path.c_str(), GENERIC_READ, FILE_SHARE_READ, NULL,
                           OPEN_EXISTING, FILE_FLAG_SEQUENTIAL_SCAN, NULL);
  if (f == INVALID_HANDLE_VALUE) {
    err->assign(GetLastErrorString());
    return -ENOENT;
  }

  for (;;) {
    DWORD len;
    char buf[64 << 10];
    if (!::ReadFile(f, buf, sizeof(buf), &len, NULL)) {
      err->assign(GetLastErrorString());
      contents->clear();
      return -1;
    }
    if (len == 0)
      break;
    contents->append(buf, len);
  }
  ::CloseHandle(f);
  return 0;
#else
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    err->assign(strerror(errno));
    return -errno;
  }

  struct stat st;
  if (fstat(fileno(f), &st) < 0) {
    err->assign(strerror(errno));
    fclose(f);
    return -errno;
  }

  // +1 is for the resize in ManifestParser::Load
  contents->reserve(st.st_size + 1);

  char buf[64 << 10];
  size_t len;
  while (!feof(f) && (len = fread(buf, 1, sizeof(buf), f)) > 0) {
    contents->append(buf, len);
  }
  if (ferror(f)) {
    err->assign(strerror(errno));  // XXX errno?
    contents->clear();
    fclose(f);
    return -errno;
  }
  fclose(f);
  return 0;
#endif
}